

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

void __thiscall
cfd::core::SchnorrSignature::SetSigHashType(SchnorrSignature *this,SigHashType *sighash_type)

{
  byte bVar1;
  uint32_t uVar2;
  CfdException *this_00;
  string local_40;
  
  uVar2 = SigHashType::GetSigHashFlag(sighash_type);
  bVar1 = (byte)uVar2;
  if ((char)bVar1 < '\0') {
    if (bVar1 < 0x84) goto LAB_00365950;
  }
  else if ((char)bVar1 < '\x04') {
LAB_00365950:
    SigHashType::operator=(&this->sighash_type_,sighash_type);
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Invalid sighash type for schnorr signature.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void SchnorrSignature::SetSigHashType(const SigHashType &sighash_type) {
  if (!IsValidSigHashType(
          static_cast<uint8_t>(sighash_type.GetSigHashFlag()))) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid sighash type for schnorr signature.");
  }
  sighash_type_ = sighash_type;
}